

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

TValue * luaH_getnum(Table *t,int key)

{
  Node *pNVar1;
  double n;
  
  if (key - 1U < (uint)t->sizearray) {
    return t->array + (int)(key - 1U);
  }
  n = (double)key;
  pNVar1 = hashnum(t,n);
  do {
    if ((pNVar1->i_key).nk.tt == 3) {
      if ((*(double *)&pNVar1->i_key == n) && (!NAN(*(double *)&pNVar1->i_key) && !NAN(n))) {
        return &pNVar1->i_val;
      }
    }
    pNVar1 = (pNVar1->i_key).nk.next;
    if (pNVar1 == (Node *)0x0) {
      return &luaO_nilobject_;
    }
  } while( true );
}

Assistant:

static const TValue*luaH_getnum(Table*t,int key){
if(cast(unsigned int,key)-1<cast(unsigned int,t->sizearray))
return&t->array[key-1];
else{
lua_Number nk=cast_num(key);
Node*n=hashnum(t,nk);
do{
if(ttisnumber(gkey(n))&&luai_numeq(nvalue(gkey(n)),nk))
return gval(n);
else n=gnext(n);
}while(n);
return(&luaO_nilobject_);
}
}